

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_xors_ppc
               (TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,TCGv_i64 c,
               uint32_t oprsz,uint32_t maxsz)

{
  TCGv_i64 out;
  TCGv_i64 tmp;
  uint32_t oprsz_local;
  TCGv_i64 c_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  out = tcg_temp_new_i64(tcg_ctx);
  gen_dup_i64(tcg_ctx,vece,out,c);
  tcg_gen_gvec_2s_ppc(tcg_ctx,dofs,aofs,oprsz,maxsz,out,&gop_xors);
  tcg_temp_free_i64(tcg_ctx,out);
  return;
}

Assistant:

void tcg_gen_gvec_xors(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                       TCGv_i64 c, uint32_t oprsz, uint32_t maxsz)
{
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
    gen_dup_i64(tcg_ctx, vece, tmp, c);
    tcg_gen_gvec_2s(tcg_ctx, dofs, aofs, oprsz, maxsz, tmp, &gop_xors);
    tcg_temp_free_i64(tcg_ctx, tmp);
}